

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq_utils.cpp
# Opt level: O1

void * zmq_threadstart(undefined1 *func_,void *arg_)

{
  thread_t *this;
  _Rb_tree_header *p_Var1;
  
  this = (thread_t *)operator_new(0x68,(nothrow_t *)&std::nothrow);
  if (this == (thread_t *)0x0) {
    this = (thread_t *)0x0;
  }
  else {
    this->_started = false;
    this->_tfn = (thread_fn *)0x0;
    this->_arg = (void *)0x0;
    this->_thread_priority = -1;
    this->_thread_sched_policy = -1;
    p_Var1 = &(this->_thread_affinity_cpus)._M_t._M_impl.super__Rb_tree_header;
    (this->_thread_affinity_cpus)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (this->_thread_affinity_cpus)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (this->_thread_affinity_cpus)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (this->_thread_affinity_cpus)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    (this->_thread_affinity_cpus)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    this->_name[0] = '\0';
    this->_name[1] = '\0';
    this->_name[2] = '\0';
    this->_name[3] = '\0';
    this->_name[4] = '\0';
    this->_name[5] = '\0';
    this->_name[6] = '\0';
    this->_name[7] = '\0';
    this->_name[8] = '\0';
    this->_name[9] = '\0';
    this->_name[10] = '\0';
    this->_name[0xb] = '\0';
    this->_name[0xc] = '\0';
    this->_name[0xd] = '\0';
    this->_name[0xe] = '\0';
    this->_name[0xf] = '\0';
  }
  if (this == (thread_t *)0x0) {
    zmq_threadstart_cold_1();
  }
  zmq::thread_t::start(this,(thread_fn *)func_,arg_,"ZMQapp");
  return this;
}

Assistant:

void *zmq_threadstart (zmq_thread_fn *func_, void *arg_)
{
    zmq::thread_t *thread = new (std::nothrow) zmq::thread_t;
    alloc_assert (thread);
    thread->start (func_, arg_, "ZMQapp");
    return thread;
}